

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_test_target.cc
# Opt level: O1

void __thiscall highwayhash::VectorTest<2U>::operator()(VectorTest<2U> *this,HHNotify notify)

{
  short sVar1;
  undefined4 uVar2;
  uint3 uVar3;
  int iVar4;
  longlong lVar5;
  short sVar6;
  short sVar7;
  undefined4 uVar8;
  undefined3 uVar9;
  int iVar10;
  short sVar11;
  short sVar12;
  undefined4 uVar13;
  uint3 uVar14;
  int iVar15;
  longlong lVar16;
  short sVar17;
  short sVar18;
  undefined4 uVar19;
  undefined3 uVar20;
  int iVar21;
  short sVar22;
  char cVar23;
  undefined1 uVar24;
  char cVar25;
  undefined1 uVar26;
  char cVar27;
  undefined1 uVar28;
  char cVar29;
  undefined1 uVar30;
  char cVar31;
  undefined1 uVar32;
  char cVar33;
  undefined1 uVar34;
  char cVar35;
  undefined1 uVar36;
  char cVar37;
  undefined1 uVar38;
  char cVar39;
  undefined1 uVar40;
  char cVar41;
  undefined1 uVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  size_t i_1;
  char *pcVar49;
  size_t i;
  long lVar50;
  size_t i_2;
  bool bVar51;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar52 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  V<unsigned_char> v2;
  V<unsigned_char> veq;
  V<unsigned_char> v3b;
  V<unsigned_char> v2b;
  V<unsigned_char> vand;
  V<unsigned_char> sub;
  V<unsigned_char> v2c;
  V<unsigned_char> vxor;
  V<unsigned_char> vor;
  V<unsigned_char> add;
  undefined8 local_130;
  undefined8 uStack_128;
  V<unsigned_char> local_120;
  char local_110;
  undefined1 uStack_10f;
  undefined2 uStack_10e;
  undefined4 uStack_10c;
  long lStack_108;
  V<unsigned_char> local_100 [2];
  V<unsigned_char> local_e0;
  V<unsigned_char> local_d0;
  V<unsigned_char> local_c0;
  V<unsigned_char> local_b0;
  V<unsigned_char> local_a0;
  V<unsigned_char> local_90;
  V<unsigned_char> local_80;
  V<unsigned_char> local_70 [4];
  
  local_120.v_[0]._0_1_ = '\x02';
  local_120.v_[0]._1_1_ = '\x02';
  local_120.v_[0]._2_1_ = '\x02';
  local_120.v_[0]._3_1_ = '\x02';
  local_120.v_[0]._4_1_ = '\x02';
  local_120.v_[0]._5_1_ = '\x02';
  local_120.v_[0]._6_1_ = '\x02';
  local_120.v_[0]._7_1_ = '\x02';
  local_120.v_[1]._0_1_ = '\x02';
  local_120.v_[1]._1_1_ = '\x02';
  local_120.v_[1]._2_1_ = '\x02';
  local_120.v_[1]._3_1_ = '\x02';
  local_120.v_[1]._4_1_ = '\x02';
  local_120.v_[1]._5_1_ = '\x02';
  local_120.v_[1]._6_1_ = '\x02';
  local_120.v_[1]._7_1_ = '\x02';
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_120,'\x02',99,notify);
  local_e0.v_[1] = 0x303030303030303;
  local_e0.v_[0] = 0x303030303030303;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_e0,'\x03',0x69,notify);
  local_100[0].v_[0] = -1;
  local_100[0].v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(local_100,0xff,0x6d,notify);
  lVar5 = CONCAT17(local_120.v_[0]._7_1_,
                   CONCAT16(local_120.v_[0]._6_1_,
                            CONCAT15(local_120.v_[0]._5_1_,
                                     CONCAT14(local_120.v_[0]._4_1_,
                                              CONCAT13(local_120.v_[0]._3_1_,
                                                       CONCAT12(local_120.v_[0]._2_1_,
                                                                CONCAT11(local_120.v_[0]._1_1_,
                                                                         (char)local_120.v_[0]))))))
                  );
  lVar16 = CONCAT17(local_120.v_[1]._7_1_,
                    CONCAT16(local_120.v_[1]._6_1_,
                             CONCAT15(local_120.v_[1]._5_1_,
                                      CONCAT14(local_120.v_[1]._4_1_,
                                               CONCAT13(local_120.v_[1]._3_1_,
                                                        CONCAT12(local_120.v_[1]._2_1_,
                                                                 CONCAT11(local_120.v_[1]._1_1_,
                                                                          (char)local_120.v_[1])))))
                            ));
  local_d0.v_[0] = lVar5;
  local_d0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_d0,'\x02',0x72,notify);
  local_a0.v_[0] = lVar5;
  local_a0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_a0,'\x02',0x77,notify);
  cVar48 = local_120.v_[1]._7_1_;
  cVar47 = local_120.v_[1]._6_1_;
  cVar46 = local_120.v_[1]._5_1_;
  cVar45 = local_120.v_[1]._4_1_;
  cVar44 = local_120.v_[1]._3_1_;
  cVar43 = local_120.v_[1]._2_1_;
  cVar41 = local_120.v_[1]._1_1_;
  cVar39 = (char)local_120.v_[1];
  cVar37 = local_120.v_[0]._7_1_;
  cVar35 = local_120.v_[0]._6_1_;
  cVar33 = local_120.v_[0]._5_1_;
  cVar31 = local_120.v_[0]._4_1_;
  cVar29 = local_120.v_[0]._3_1_;
  cVar27 = local_120.v_[0]._2_1_;
  cVar25 = local_120.v_[0]._1_1_;
  cVar23 = (char)local_120.v_[0];
  local_70[0].v_[0]._0_4_ =
       CONCAT13(local_120.v_[0]._3_1_ + '\x03',
                CONCAT12(local_120.v_[0]._2_1_ + '\x03',
                         CONCAT11(local_120.v_[0]._1_1_ + '\x03',(char)local_120.v_[0] + '\x03')));
  local_70[0].v_[0]._0_6_ =
       CONCAT15(local_120.v_[0]._5_1_ + '\x03',
                CONCAT14(local_120.v_[0]._4_1_ + '\x03',(undefined4)local_70[0].v_[0]));
  local_70[0].v_[0] =
       CONCAT17(local_120.v_[0]._7_1_ + '\x03',
                CONCAT16(local_120.v_[0]._6_1_ + '\x03',(undefined6)local_70[0].v_[0]));
  local_70[0].v_[1]._0_4_ =
       CONCAT13(local_120.v_[1]._3_1_ + '\x03',
                CONCAT12(local_120.v_[1]._2_1_ + '\x03',
                         CONCAT11(local_120.v_[1]._1_1_ + '\x03',(char)local_120.v_[1] + '\x03')));
  local_70[0].v_[1]._0_6_ =
       CONCAT15(local_120.v_[1]._5_1_ + '\x03',
                CONCAT14(local_120.v_[1]._4_1_ + '\x03',(undefined4)local_70[0].v_[1]));
  local_70[0].v_[1] =
       CONCAT17(local_120.v_[1]._7_1_ + '\x03',
                CONCAT16(local_120.v_[1]._6_1_ + '\x03',(undefined6)local_70[0].v_[1]));
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(local_70,'\x05',0x7a,notify);
  local_b0.v_[0]._0_4_ =
       CONCAT13('\x03' - cVar29,CONCAT12('\x03' - cVar27,CONCAT11('\x03' - cVar25,'\x03' - cVar23)))
  ;
  local_b0.v_[0]._0_6_ =
       CONCAT15('\x03' - cVar33,CONCAT14('\x03' - cVar31,(undefined4)local_b0.v_[0]));
  local_b0.v_[0] = CONCAT17('\x03' - cVar37,CONCAT16('\x03' - cVar35,(undefined6)local_b0.v_[0]));
  local_b0.v_[1]._0_4_ =
       CONCAT13('\x03' - cVar44,CONCAT12('\x03' - cVar43,CONCAT11('\x03' - cVar41,'\x03' - cVar39)))
  ;
  local_b0.v_[1]._0_6_ =
       CONCAT15('\x03' - cVar46,CONCAT14('\x03' - cVar45,(undefined4)local_b0.v_[1]));
  local_b0.v_[1] = CONCAT17('\x03' - cVar48,CONCAT16('\x03' - cVar47,(undefined6)local_b0.v_[1]));
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_b0,'\x01',0x7d,notify);
  uVar2 = CONCAT13(local_120.v_[0]._3_1_,
                   CONCAT12(local_120.v_[0]._2_1_,
                            CONCAT11(local_120.v_[0]._1_1_,(char)local_120.v_[0])));
  uVar8 = CONCAT13(local_120.v_[0]._7_1_,
                   CONCAT12(local_120.v_[0]._6_1_,
                            CONCAT11(local_120.v_[0]._5_1_,local_120.v_[0]._4_1_)));
  uVar13 = CONCAT13(local_120.v_[1]._3_1_,
                    CONCAT12(local_120.v_[1]._2_1_,
                             CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1])));
  uVar19 = CONCAT13(local_120.v_[1]._7_1_,
                    CONCAT12(local_120.v_[1]._6_1_,
                             CONCAT11(local_120.v_[1]._5_1_,local_120.v_[1]._4_1_)));
  local_130 = CONCAT44(uVar8,uVar2);
  uStack_128 = CONCAT44(uVar19,uVar13);
  local_c0.v_[0] = CONCAT44(uVar8,uVar2) & 0x303030303030303;
  local_c0.v_[1] = CONCAT44(uVar19,uVar13) & 0x303030303030303;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_c0,'\x02',0x80,notify);
  local_80.v_[0] = local_70[0].v_[0] | local_130;
  local_80.v_[1] = local_70[0].v_[1] | uStack_128;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_80,'\a',0x83,notify);
  local_90.v_[0] = CONCAT44(uVar8,uVar2) ^ 0x303030303030303;
  local_90.v_[1] = CONCAT44(uVar19,uVar13) ^ 0x303030303030303;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_90,'\x01',0x86,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 2;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 2;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 2;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 2;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 2;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 2;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,2,99,notify);
  local_e0.v_ = (Intrinsic)pmovsxbw(extraout_XMM0,0x303030303030303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_e0,3,0x69,notify);
  local_100[0].v_[0] = -1;
  local_100[0].v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)local_100,0xffff,0x6d,notify);
  lVar5 = CONCAT17(local_120.v_[0]._7_1_,
                   CONCAT16(local_120.v_[0]._6_1_,
                            CONCAT15(local_120.v_[0]._5_1_,
                                     CONCAT14(local_120.v_[0]._4_1_,
                                              CONCAT13(local_120.v_[0]._3_1_,
                                                       CONCAT12(local_120.v_[0]._2_1_,
                                                                CONCAT11(local_120.v_[0]._1_1_,
                                                                         (char)local_120.v_[0]))))))
                  );
  lVar16 = CONCAT17(local_120.v_[1]._7_1_,
                    CONCAT16(local_120.v_[1]._6_1_,
                             CONCAT15(local_120.v_[1]._5_1_,
                                      CONCAT14(local_120.v_[1]._4_1_,
                                               CONCAT13(local_120.v_[1]._3_1_,
                                                        CONCAT12(local_120.v_[1]._2_1_,
                                                                 CONCAT11(local_120.v_[1]._1_1_,
                                                                          (char)local_120.v_[1])))))
                            ));
  local_d0.v_[0] = lVar5;
  local_d0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_d0,2,0x72,notify);
  local_a0.v_[0] = lVar5;
  local_a0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_a0,2,0x77,notify);
  sVar1 = CONCAT11(local_120.v_[0]._1_1_,(char)local_120.v_[0]);
  sVar6 = CONCAT11(local_120.v_[0]._3_1_,local_120.v_[0]._2_1_);
  sVar7 = CONCAT11(local_120.v_[0]._5_1_,local_120.v_[0]._4_1_);
  sVar11 = CONCAT11(local_120.v_[0]._7_1_,local_120.v_[0]._6_1_);
  sVar12 = CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1]);
  sVar17 = CONCAT11(local_120.v_[1]._3_1_,local_120.v_[1]._2_1_);
  sVar18 = CONCAT11(local_120.v_[1]._5_1_,local_120.v_[1]._4_1_);
  sVar22 = CONCAT11(local_120.v_[1]._7_1_,local_120.v_[1]._6_1_);
  local_70[0].v_[0]._0_4_ = CONCAT22(sVar6 + 3,sVar1 + 3);
  local_70[0].v_[0]._0_6_ = CONCAT24(sVar7 + 3,(undefined4)local_70[0].v_[0]);
  local_70[0].v_[0] = CONCAT26(sVar11 + 3,(undefined6)local_70[0].v_[0]);
  local_70[0].v_[1]._0_4_ = CONCAT22(sVar17 + 3,sVar12 + 3);
  local_70[0].v_[1]._0_6_ = CONCAT24(sVar18 + 3,(undefined4)local_70[0].v_[1]);
  local_70[0].v_[1] = CONCAT26(sVar22 + 3,(undefined6)local_70[0].v_[1]);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)local_70,5,0x7a,notify);
  auVar52 = pmovsxbw(extraout_XMM0_00,0x303030303030303);
  local_b0.v_[0]._0_4_ = CONCAT22(auVar52._2_2_ - sVar6,auVar52._0_2_ - sVar1);
  local_b0.v_[0]._0_6_ = CONCAT24(auVar52._4_2_ - sVar7,(undefined4)local_b0.v_[0]);
  local_b0.v_[0] = CONCAT26(auVar52._6_2_ - sVar11,(undefined6)local_b0.v_[0]);
  local_b0.v_[1]._0_4_ = CONCAT22(auVar52._10_2_ - sVar17,auVar52._8_2_ - sVar12);
  local_b0.v_[1]._0_6_ = CONCAT24(auVar52._12_2_ - sVar18,(undefined4)local_b0.v_[1]);
  local_b0.v_[1] = CONCAT26(auVar52._14_2_ - sVar22,(undefined6)local_b0.v_[1]);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_b0,1,0x7d,notify);
  uVar3 = CONCAT12(local_120.v_[0]._2_1_,CONCAT11(local_120.v_[0]._1_1_,(char)local_120.v_[0]));
  uVar2 = CONCAT13(local_120.v_[0]._3_1_,uVar3);
  uVar9 = CONCAT12(local_120.v_[0]._6_1_,CONCAT11(local_120.v_[0]._5_1_,local_120.v_[0]._4_1_));
  uVar8 = CONCAT13(local_120.v_[0]._7_1_,uVar9);
  uVar14 = CONCAT12(local_120.v_[1]._2_1_,CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1]));
  uVar13 = CONCAT13(local_120.v_[1]._3_1_,uVar14);
  uVar20 = CONCAT12(local_120.v_[1]._6_1_,CONCAT11(local_120.v_[1]._5_1_,local_120.v_[1]._4_1_));
  uVar19 = CONCAT13(local_120.v_[1]._7_1_,uVar20);
  local_130 = CONCAT44(uVar8,uVar2);
  uStack_128 = CONCAT44(uVar19,uVar13);
  local_c0.v_[0] = (ulong)CONCAT34(uVar9,(uint)uVar3) & 0x3000300030003;
  local_c0.v_[1] = (ulong)CONCAT34(uVar20,(uint)uVar14) & 0x3000300030003;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_c0,2,0x80,notify);
  local_80.v_[0] = local_70[0].v_[0] | local_130;
  local_80.v_[1] = local_70[0].v_[1] | uStack_128;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_80,7,0x83,notify);
  local_90.v_[0] = CONCAT44(uVar8,uVar2) ^ 0x3000300030003;
  local_90.v_[1] = CONCAT44(uVar19,uVar13) ^ 0x3000300030003;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_90,1,0x86,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 2;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 2;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,2,99,notify);
  local_e0.v_ = (Intrinsic)pmovsxbd(extraout_XMM0_01,0x3030303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_e0,3,0x69,notify);
  local_100[0].v_[0] = -1;
  local_100[0].v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)local_100,0xffffffff,0x6d,notify);
  lVar5 = CONCAT17(local_120.v_[0]._7_1_,
                   CONCAT16(local_120.v_[0]._6_1_,
                            CONCAT15(local_120.v_[0]._5_1_,
                                     CONCAT14(local_120.v_[0]._4_1_,
                                              CONCAT13(local_120.v_[0]._3_1_,
                                                       CONCAT12(local_120.v_[0]._2_1_,
                                                                CONCAT11(local_120.v_[0]._1_1_,
                                                                         (char)local_120.v_[0]))))))
                  );
  lVar16 = CONCAT17(local_120.v_[1]._7_1_,
                    CONCAT16(local_120.v_[1]._6_1_,
                             CONCAT15(local_120.v_[1]._5_1_,
                                      CONCAT14(local_120.v_[1]._4_1_,
                                               CONCAT13(local_120.v_[1]._3_1_,
                                                        CONCAT12(local_120.v_[1]._2_1_,
                                                                 CONCAT11(local_120.v_[1]._1_1_,
                                                                          (char)local_120.v_[1])))))
                            ));
  local_d0.v_[0] = lVar5;
  local_d0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_d0,2,0x72,notify);
  local_a0.v_[0] = lVar5;
  local_a0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_a0,2,0x77,notify);
  iVar4 = CONCAT13(local_120.v_[0]._3_1_,
                   CONCAT12(local_120.v_[0]._2_1_,
                            CONCAT11(local_120.v_[0]._1_1_,(char)local_120.v_[0])));
  iVar10 = CONCAT13(local_120.v_[0]._7_1_,
                    CONCAT12(local_120.v_[0]._6_1_,
                             CONCAT11(local_120.v_[0]._5_1_,local_120.v_[0]._4_1_)));
  iVar15 = CONCAT13(local_120.v_[1]._3_1_,
                    CONCAT12(local_120.v_[1]._2_1_,
                             CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1])));
  iVar21 = CONCAT13(local_120.v_[1]._7_1_,
                    CONCAT12(local_120.v_[1]._6_1_,
                             CONCAT11(local_120.v_[1]._5_1_,local_120.v_[1]._4_1_)));
  local_70[0].v_[0] = CONCAT44(iVar10 + 3,iVar4 + 3);
  local_70[0].v_[1] = CONCAT44(iVar21 + 3,iVar15 + 3);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)local_70,5,0x7a,notify);
  auVar52 = pmovsxbd(extraout_XMM0_02,0x3030303);
  local_b0.v_[0] = CONCAT44(auVar52._4_4_ - iVar10,auVar52._0_4_ - iVar4);
  local_b0.v_[1] = CONCAT44(auVar52._12_4_ - iVar21,auVar52._8_4_ - iVar15);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_b0,1,0x7d,notify);
  uVar3 = CONCAT12(local_120.v_[0]._2_1_,CONCAT11(local_120.v_[0]._1_1_,(char)local_120.v_[0]));
  uVar2 = CONCAT13(local_120.v_[0]._3_1_,uVar3);
  uVar9 = CONCAT12(local_120.v_[0]._6_1_,CONCAT11(local_120.v_[0]._5_1_,local_120.v_[0]._4_1_));
  uVar8 = CONCAT13(local_120.v_[0]._7_1_,uVar9);
  uVar14 = CONCAT12(local_120.v_[1]._2_1_,CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1]));
  uVar13 = CONCAT13(local_120.v_[1]._3_1_,uVar14);
  uVar20 = CONCAT12(local_120.v_[1]._6_1_,CONCAT11(local_120.v_[1]._5_1_,local_120.v_[1]._4_1_));
  uVar19 = CONCAT13(local_120.v_[1]._7_1_,uVar20);
  local_130 = CONCAT44(uVar8,uVar2);
  uStack_128 = CONCAT44(uVar19,uVar13);
  local_c0.v_[0] = (ulong)CONCAT34(uVar9,(uint)uVar3) & 0x300000003;
  local_c0.v_[1] = (ulong)CONCAT34(uVar20,(uint)uVar14) & 0x300000003;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_c0,2,0x80,notify);
  local_80.v_[0] = local_70[0].v_[0] | local_130;
  local_80.v_[1] = local_70[0].v_[1] | uStack_128;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_80,7,0x83,notify);
  local_90.v_[0] = CONCAT44(uVar8,uVar2) ^ 0x300000003;
  local_90.v_[1] = CONCAT44(uVar19,uVar13) ^ 0x300000003;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_90,1,0x86,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_120,2,99,notify);
  local_e0.v_ = (Intrinsic)pmovsxbq(extraout_XMM0_03,0x303);
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_e0,3,0x69,notify)
  ;
  local_100[0].v_[0] = -1;
  local_100[0].v_[1] = -1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)local_100,0xffffffffffffffff,0x6d,notify);
  local_d0.v_[0] = 2;
  local_d0.v_[1] = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_d0,2,0x72,notify)
  ;
  local_a0.v_[0] = 2;
  local_a0.v_[1] = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_a0,2,0x77,notify)
  ;
  local_70[0].v_[0] = 5;
  local_70[0].v_[1] = 5;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)local_70,5,0x7a,notify);
  local_b0.v_[0] = 1;
  local_b0.v_[1] = 1;
  lVar50 = 1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_b0,1,0x7d,notify)
  ;
  local_c0.v_[0] = 2;
  local_c0.v_[1] = 2;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_c0,2,0x80,notify)
  ;
  local_80.v_[0] = 7;
  local_80.v_[1] = 7;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_80,7,0x83,notify)
  ;
  local_90.v_[0] = 1;
  local_90.v_[1] = 1;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_90,1,0x86,notify)
  ;
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,0,0x8e,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 2;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 2;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 2;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 2;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 2;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 2;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,2,0x91,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0x80;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0x80;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0x80;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0x80;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0x80;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0x80;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0x80;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0x80;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,0x8000,0x97,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_120,0,0x9b,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,0,0x8e,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 2;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 2;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,2,0x91,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0x80;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0x80;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0x80;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0x80;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>
            ((V<unsigned_int> *)&local_120,0x80000000,0x97,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_120,0,0x9b,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,0,0x8e,notify);
  local_120.v_[0]._0_1_ = 2;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 2;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,2,0x91,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0x80;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0x80;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,0x8000000000000000,0x97,notify);
  local_120.v_[0]._0_1_ = 0;
  local_120.v_[0]._1_1_ = 0;
  local_120.v_[0]._2_1_ = 0;
  local_120.v_[0]._3_1_ = 0;
  local_120.v_[0]._4_1_ = 0;
  local_120.v_[0]._5_1_ = 0;
  local_120.v_[0]._6_1_ = 0;
  local_120.v_[0]._7_1_ = 0;
  local_120.v_[1]._0_1_ = 0;
  local_120.v_[1]._1_1_ = 0;
  local_120.v_[1]._2_1_ = 0;
  local_120.v_[1]._3_1_ = 0;
  local_120.v_[1]._4_1_ = 0;
  local_120.v_[1]._5_1_ = 0;
  local_120.v_[1]._6_1_ = 0;
  local_120.v_[1]._7_1_ = 0;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>
            ((V<unsigned_long> *)&local_120,0,0x9b,notify);
  local_120.v_[0]._0_1_ = 4;
  local_120.v_[0]._1_1_ = 4;
  local_120.v_[0]._2_1_ = 4;
  local_120.v_[0]._3_1_ = 4;
  local_120.v_[0]._4_1_ = 4;
  local_120.v_[0]._5_1_ = 4;
  local_120.v_[0]._6_1_ = 4;
  local_120.v_[0]._7_1_ = 4;
  local_120.v_[1]._0_1_ = 4;
  local_120.v_[1]._1_1_ = 4;
  local_120.v_[1]._2_1_ = 4;
  local_120.v_[1]._3_1_ = 4;
  local_120.v_[1]._4_1_ = 4;
  local_120.v_[1]._5_1_ = 4;
  local_120.v_[1]._6_1_ = 4;
  local_120.v_[1]._7_1_ = 4;
  local_110 = '\x05';
  uStack_10f = 5;
  uStack_10e = 0x505;
  uStack_10c = 0x5050505;
  lStack_108 = 0x505050505050505;
  local_e0.v_[1] = 0x404040404040404;
  local_e0.v_[0] = 0x404040404040404;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_e0,'\x04',0xaa,notify);
  local_100[0].v_[0] = 0x404040404040404;
  local_100[0].v_[1] = 0x404040404040404;
  local_d0.v_[0] = 0x404040404040404;
  local_d0.v_[1] = 0x404040404040404;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_char>(&local_d0,'\x04',0xaf,notify);
  local_100[0].v_[0] =
       CONCAT17((char)local_120.v_[1],
                CONCAT16(local_120.v_[0]._7_1_,
                         CONCAT15(local_120.v_[0]._6_1_,
                                  CONCAT14(local_120.v_[0]._5_1_,
                                           CONCAT13(local_120.v_[0]._4_1_,
                                                    CONCAT12(local_120.v_[0]._3_1_,
                                                             CONCAT11(local_120.v_[0]._2_1_,
                                                                      local_120.v_[0]._1_1_)))))));
  local_100[0].v_[1] =
       CONCAT17(local_110,
                CONCAT16(local_120.v_[1]._7_1_,
                         CONCAT15(local_120.v_[1]._6_1_,
                                  CONCAT14(local_120.v_[1]._5_1_,
                                           CONCAT13(local_120.v_[1]._4_1_,
                                                    CONCAT12(local_120.v_[1]._3_1_,
                                                             CONCAT11(local_120.v_[1]._2_1_,
                                                                      local_120.v_[1]._1_1_)))))));
  if (local_110 != '\x05') {
    pcVar49 = TargetName(2);
    (*notify)(pcVar49,0xb40001);
  }
  do {
    if (*(char *)((long)local_100[0].v_ + lVar50) != '\x04') {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xb60001);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0xf);
  local_120.v_[1]._0_1_ = 4;
  local_120.v_[1]._1_1_ = 4;
  local_120.v_[1]._2_1_ = 4;
  local_120.v_[1]._3_1_ = 4;
  local_120.v_[1]._4_1_ = 4;
  local_120.v_[1]._5_1_ = 4;
  local_120.v_[1]._6_1_ = 4;
  local_120.v_[1]._7_1_ = 4;
  local_110 = 4;
  uStack_10f = 4;
  uStack_10e = 0x404;
  uStack_10c = 0x4040404;
  lVar50 = 0;
  do {
    if (*(char *)((long)local_120.v_ + lVar50) != '\x04') {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xbd0001);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0x18);
  lVar50 = 0x18;
  do {
    if (*(char *)((long)local_120.v_ + lVar50) != '\x05') {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xc10001);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0x20);
  lVar50 = 0;
  do {
    *(undefined2 *)((long)local_120.v_ + lVar50 * 2) = 4;
    uVar42 = local_120.v_[1]._1_1_;
    uVar40 = (char)local_120.v_[1];
    uVar38 = local_120.v_[0]._7_1_;
    uVar36 = local_120.v_[0]._6_1_;
    uVar34 = local_120.v_[0]._5_1_;
    uVar32 = local_120.v_[0]._4_1_;
    uVar30 = local_120.v_[0]._3_1_;
    uVar28 = local_120.v_[0]._2_1_;
    uVar26 = local_120.v_[0]._1_1_;
    uVar24 = (char)local_120.v_[0];
    lVar50 = lVar50 + 1;
  } while (lVar50 != 8);
  lVar50 = 0x10;
  do {
    *(undefined2 *)((long)local_120.v_ + lVar50) = 5;
    lVar50 = lVar50 + 2;
  } while (lVar50 != 0x20);
  lVar5 = CONCAT17(local_120.v_[0]._7_1_,
                   CONCAT16(local_120.v_[0]._6_1_,
                            CONCAT15(local_120.v_[0]._5_1_,
                                     CONCAT14(local_120.v_[0]._4_1_,
                                              CONCAT13(local_120.v_[0]._3_1_,
                                                       CONCAT12(local_120.v_[0]._2_1_,
                                                                CONCAT11(local_120.v_[0]._1_1_,
                                                                         (char)local_120.v_[0]))))))
                  );
  uVar2 = CONCAT13(local_120.v_[1]._3_1_,
                   CONCAT12(local_120.v_[1]._2_1_,
                            CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1])));
  lVar16 = CONCAT17(local_120.v_[1]._7_1_,
                    CONCAT16(local_120.v_[1]._6_1_,
                             CONCAT15(local_120.v_[1]._5_1_,CONCAT14(local_120.v_[1]._4_1_,uVar2))))
  ;
  local_e0.v_[1] = lVar16;
  local_e0.v_[0] = lVar5;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_e0,4,0xaa,notify);
  local_100[0].v_[0] = lVar5;
  local_100[0].v_[1] = lVar16;
  local_d0.v_[0] = lVar5;
  local_d0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_short>
            ((V<unsigned_short> *)&local_d0,4,0xaf,notify);
  local_100[0].v_[0] =
       CONCAT17(local_120.v_[1]._1_1_,
                CONCAT16((char)local_120.v_[1],
                         CONCAT15(local_120.v_[0]._7_1_,
                                  CONCAT14(local_120.v_[0]._6_1_,
                                           CONCAT13(local_120.v_[0]._5_1_,
                                                    CONCAT12(local_120.v_[0]._4_1_,
                                                             CONCAT11(local_120.v_[0]._3_1_,
                                                                      local_120.v_[0]._2_1_)))))));
  local_100[0].v_[1] =
       CONCAT17(uStack_10f,
                CONCAT16(local_110,
                         CONCAT15(local_120.v_[1]._7_1_,
                                  CONCAT14(local_120.v_[1]._6_1_,
                                           CONCAT13(local_120.v_[1]._5_1_,
                                                    CONCAT12(local_120.v_[1]._4_1_,
                                                             CONCAT11(local_120.v_[1]._3_1_,
                                                                      local_120.v_[1]._2_1_)))))));
  lVar5 = local_100[0].v_[1];
  local_100[0].v_[1]._6_2_ = (short)((ulong)local_100[0].v_[1] >> 0x30);
  bVar51 = local_100[0].v_[1]._6_2_ != 5;
  local_100[0].v_[1] = lVar5;
  if (bVar51) {
    pcVar49 = TargetName(2);
    (*notify)(pcVar49,0xb40002);
  }
  lVar50 = 1;
  do {
    if (*(short *)((long)local_100[0].v_ + lVar50 * 2) != 4) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xb60002);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 7);
  local_120.v_[1]._0_1_ = uVar24;
  local_120.v_[1]._1_1_ = uVar26;
  local_120.v_[1]._2_1_ = uVar28;
  local_120.v_[1]._3_1_ = uVar30;
  local_120.v_[1]._4_1_ = uVar32;
  local_120.v_[1]._5_1_ = uVar34;
  local_120.v_[1]._6_1_ = uVar36;
  local_120.v_[1]._7_1_ = uVar38;
  local_110 = uVar40;
  uStack_10f = uVar42;
  uStack_10e = (undefined2)((uint)uVar2 >> 0x10);
  uStack_10c = (undefined4)((ulong)lVar16 >> 0x20);
  lVar50 = 0;
  do {
    if (*(short *)((long)local_120.v_ + lVar50 * 2) != 4) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xbd0002);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0xc);
  lVar50 = 0xc;
  do {
    if (*(short *)((long)local_120.v_ + lVar50 * 2) != 5) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xc10002);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 0x10);
  lVar50 = 0;
  do {
    *(undefined4 *)((long)local_120.v_ + lVar50 * 4) = 4;
    uVar42 = local_120.v_[1]._1_1_;
    uVar40 = (char)local_120.v_[1];
    uVar38 = local_120.v_[0]._7_1_;
    uVar36 = local_120.v_[0]._6_1_;
    uVar34 = local_120.v_[0]._5_1_;
    uVar32 = local_120.v_[0]._4_1_;
    uVar30 = local_120.v_[0]._3_1_;
    uVar28 = local_120.v_[0]._2_1_;
    uVar26 = local_120.v_[0]._1_1_;
    uVar24 = (char)local_120.v_[0];
    lVar50 = lVar50 + 1;
  } while (lVar50 != 4);
  lVar50 = 4;
  do {
    *(undefined4 *)((long)local_120.v_ + lVar50 * 4) = 5;
    lVar50 = lVar50 + 1;
  } while (lVar50 != 8);
  lVar5 = CONCAT17(local_120.v_[0]._7_1_,
                   CONCAT16(local_120.v_[0]._6_1_,
                            CONCAT15(local_120.v_[0]._5_1_,
                                     CONCAT14(local_120.v_[0]._4_1_,
                                              CONCAT13(local_120.v_[0]._3_1_,
                                                       CONCAT12(local_120.v_[0]._2_1_,
                                                                CONCAT11(local_120.v_[0]._1_1_,
                                                                         (char)local_120.v_[0]))))))
                  );
  uVar2 = CONCAT13(local_120.v_[1]._3_1_,
                   CONCAT12(local_120.v_[1]._2_1_,
                            CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1])));
  lVar16 = CONCAT17(local_120.v_[1]._7_1_,
                    CONCAT16(local_120.v_[1]._6_1_,
                             CONCAT15(local_120.v_[1]._5_1_,CONCAT14(local_120.v_[1]._4_1_,uVar2))))
  ;
  local_e0.v_[1] = lVar16;
  local_e0.v_[0] = lVar5;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_e0,4,0xaa,notify);
  local_100[0].v_[0] = lVar5;
  local_100[0].v_[1] = lVar16;
  local_d0.v_[0] = lVar5;
  local_d0.v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_int>((V<unsigned_int> *)&local_d0,4,0xaf,notify);
  local_100[0].v_[0] =
       CONCAT17(local_120.v_[1]._3_1_,
                CONCAT16(local_120.v_[1]._2_1_,
                         CONCAT15(local_120.v_[1]._1_1_,
                                  CONCAT14((char)local_120.v_[1],
                                           CONCAT13(local_120.v_[0]._7_1_,
                                                    CONCAT12(local_120.v_[0]._6_1_,
                                                             CONCAT11(local_120.v_[0]._5_1_,
                                                                      local_120.v_[0]._4_1_)))))));
  local_100[0].v_[1] =
       CONCAT26(uStack_10e,
                CONCAT15(uStack_10f,
                         CONCAT14(local_110,
                                  CONCAT13(local_120.v_[1]._7_1_,
                                           CONCAT12(local_120.v_[1]._6_1_,
                                                    CONCAT11(local_120.v_[1]._5_1_,
                                                             local_120.v_[1]._4_1_))))));
  lVar5 = local_100[0].v_[1];
  local_100[0].v_[1]._4_4_ = (int)((ulong)local_100[0].v_[1] >> 0x20);
  bVar51 = local_100[0].v_[1]._4_4_ != 5;
  local_100[0].v_[1] = lVar5;
  if (bVar51) {
    pcVar49 = TargetName(2);
    (*notify)(pcVar49,0xb40004);
  }
  lVar50 = 1;
  do {
    if (*(int *)((long)local_100[0].v_ + lVar50 * 4) != 4) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xb60004);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 3);
  local_120.v_[1]._0_1_ = uVar24;
  local_120.v_[1]._1_1_ = uVar26;
  local_120.v_[1]._2_1_ = uVar28;
  local_120.v_[1]._3_1_ = uVar30;
  local_120.v_[1]._4_1_ = uVar32;
  local_120.v_[1]._5_1_ = uVar34;
  local_120.v_[1]._6_1_ = uVar36;
  local_120.v_[1]._7_1_ = uVar38;
  local_110 = uVar40;
  uStack_10f = uVar42;
  uStack_10e = (undefined2)((uint)uVar2 >> 0x10);
  uStack_10c = (undefined4)((ulong)lVar16 >> 0x20);
  lVar50 = 0;
  do {
    if (*(int *)((long)local_120.v_ + lVar50 * 4) != 4) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xbd0004);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 6);
  lVar50 = 6;
  do {
    if (*(int *)((long)local_120.v_ + lVar50 * 4) != 5) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xc10004);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 8);
  lVar50 = 0;
  do {
    local_120.v_[lVar50] = 4;
    uVar42 = local_120.v_[1]._1_1_;
    uVar40 = (char)local_120.v_[1];
    uVar38 = local_120.v_[0]._7_1_;
    uVar36 = local_120.v_[0]._6_1_;
    uVar34 = local_120.v_[0]._5_1_;
    uVar32 = local_120.v_[0]._4_1_;
    uVar30 = local_120.v_[0]._3_1_;
    uVar28 = local_120.v_[0]._2_1_;
    uVar26 = local_120.v_[0]._1_1_;
    uVar24 = (char)local_120.v_[0];
    lVar50 = lVar50 + 1;
  } while (lVar50 == 1);
  lVar50 = 2;
  do {
    local_120.v_[lVar50] = 5;
    lVar50 = lVar50 + 1;
  } while (lVar50 != 4);
  lVar5 = CONCAT17(local_120.v_[0]._7_1_,
                   CONCAT16(local_120.v_[0]._6_1_,
                            CONCAT15(local_120.v_[0]._5_1_,
                                     CONCAT14(local_120.v_[0]._4_1_,
                                              CONCAT13(local_120.v_[0]._3_1_,
                                                       CONCAT12(local_120.v_[0]._2_1_,
                                                                CONCAT11(local_120.v_[0]._1_1_,
                                                                         (char)local_120.v_[0]))))))
                  );
  uVar2 = CONCAT13(local_120.v_[1]._3_1_,
                   CONCAT12(local_120.v_[1]._2_1_,
                            CONCAT11(local_120.v_[1]._1_1_,(char)local_120.v_[1])));
  lVar16 = CONCAT17(local_120.v_[1]._7_1_,
                    CONCAT16(local_120.v_[1]._6_1_,
                             CONCAT15(local_120.v_[1]._5_1_,CONCAT14(local_120.v_[1]._4_1_,uVar2))))
  ;
  local_e0.v_[1] = lVar16;
  local_e0.v_[0] = lVar5;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)&local_e0,4,0xaa,notify)
  ;
  local_100[0].v_[0] = lVar5;
  local_100[0].v_[1] = lVar16;
  SSE41::anon_unknown_8::NotifyIfUnequal<unsigned_long>((V<unsigned_long> *)local_100,4,0xaf,notify)
  ;
  if (CONCAT44(uStack_10c,CONCAT22(uStack_10e,CONCAT11(uStack_10f,local_110))) != 5) {
    pcVar49 = TargetName(2);
    (*notify)(pcVar49,0xb40008);
  }
  local_120.v_[1]._0_1_ = uVar24;
  local_120.v_[1]._1_1_ = uVar26;
  local_120.v_[1]._2_1_ = uVar28;
  local_120.v_[1]._3_1_ = uVar30;
  local_120.v_[1]._4_1_ = uVar32;
  local_120.v_[1]._5_1_ = uVar34;
  local_120.v_[1]._6_1_ = uVar36;
  local_120.v_[1]._7_1_ = uVar38;
  local_110 = uVar40;
  uStack_10f = uVar42;
  uStack_10e = (undefined2)((uint)uVar2 >> 0x10);
  uStack_10c = (undefined4)((ulong)lVar16 >> 0x20);
  lVar50 = 0;
  do {
    if (local_120.v_[lVar50] != 4) {
      pcVar49 = TargetName(2);
      (*notify)(pcVar49,0xbd0008);
    }
    lVar50 = lVar50 + 1;
  } while (lVar50 != 3);
  if (lStack_108 != 5) {
    pcVar49 = TargetName(2);
    (*notify)(pcVar49,0xc10008);
  }
  return;
}

Assistant:

void VectorTest<Target>::operator()(const HHNotify notify) const {
  HH_TARGET_NAME::TestAll(notify);
}